

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Bytes __thiscall Omega_h::gt_each<double>(Omega_h *this,Read<double> *a,Read<double> *b)

{
  void *extraout_RDX;
  Bytes BVar1;
  Write<signed_char> local_120;
  undefined1 local_110 [8];
  type f;
  allocator local_c9;
  string local_c8 [32];
  undefined1 local_a8 [8];
  Write<signed_char> c;
  Read<double> *b_local;
  Read<double> *a_local;
  ulong local_40;
  ulong local_30;
  ulong local_20;
  LO local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  if (((ulong)(b->write_).shared_alloc_.alloc & 1) == 0) {
    local_30 = ((b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_30 = (ulong)(b->write_).shared_alloc_.alloc >> 3;
  }
  c.shared_alloc_.direct_ptr = b;
  if ((int)(local_20 >> 3) == (int)(local_30 >> 3)) {
    if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
      local_40 = ((a->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_40 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"",&local_c9);
    Write<signed_char>::Write((Write<signed_char> *)local_a8,(LO)(local_40 >> 3),(string *)local_c8)
    ;
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    Write<signed_char>::Write((Write<signed_char> *)local_110,(Write<signed_char> *)local_a8);
    Read<double>::Read((Read<double> *)&f.c.shared_alloc_.direct_ptr,a);
    Read<double>::Read((Read<double> *)&f.a.write_.shared_alloc_.direct_ptr,b);
    if (((ulong)local_a8 & 1) == 0) {
      local_10 = (LO)*(size_t *)local_a8;
    }
    else {
      local_10 = (LO)((ulong)local_a8 >> 3);
    }
    parallel_for<Omega_h::gt_each<double>(Omega_h::Read<double>,Omega_h::Read<double>)::_lambda(int)_1_>
              (local_10,(type *)local_110,"gt_each");
    Write<signed_char>::Write(&local_120,(Write<signed_char> *)local_a8);
    Read<signed_char>::Read((Read<signed_char> *)this,&local_120);
    Write<signed_char>::~Write(&local_120);
    gt_each<double>(Omega_h::Read<double>,Omega_h::Read<double>)::{lambda(int)#1}::~Read
              ((_lambda_int__1_ *)local_110);
    Write<signed_char>::~Write((Write<signed_char> *)local_a8);
    BVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
    BVar1.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Bytes)BVar1.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0xf8);
}

Assistant:

Bytes gt_each(Read<T> a, Read<T> b) {
  OMEGA_H_CHECK(a.size() == b.size());
  Write<I8> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = (a[i] > b[i]); };
  parallel_for(c.size(), f, "gt_each");
  return c;
}